

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

void NJamSpell::
     InitializeBuckets<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
               (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *grams,TPerfectHash *ph,
               vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
               *buckets)

{
  pointer ppVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  __node_base *p_Var8;
  undefined1 local_58 [8];
  string key;
  
  p_Var8 = &(grams->_M_h)._M_before_begin;
  key.field_2._8_8_ = ph;
  while( true ) {
    p_Var8 = p_Var8->_M_nxt;
    if (p_Var8 == (__node_base *)0x0) {
      return;
    }
    DumpKey<unsigned_int>((string *)local_58,(uint *)(p_Var8 + 1));
    uVar4 = TPerfectHash::Hash((TPerfectHash *)key.field_2._8_8_,(string *)local_58);
    uVar7 = (ulong)uVar4;
    uVar5 = (long)(buckets->
                  super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(buckets->
                  super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar5 <= uVar7) {
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,"\n");
      uVar5 = (long)(buckets->
                    super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(buckets->
                    super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2;
    }
    if (uVar5 <= uVar7) break;
    uVar2 = CityHash16((string *)local_58);
    uVar3 = PackInt32(*(uint32_t *)((long)(p_Var8 + 1) + 4));
    ppVar1 = (buckets->
             super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar1[uVar7].first = uVar2;
    ppVar1[uVar7].second = uVar3;
    std::__cxx11::string::~string((string *)local_58);
  }
  __assert_fail("bucket < buckets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                ,0x5a,
                "void NJamSpell::InitializeBuckets(const T &, TPerfectHash &, std::vector<std::pair<uint16_t, uint16_t>> &) [T = std::unordered_map<unsigned int, unsigned int>]"
               );
}

Assistant:

void InitializeBuckets(const T& grams, TPerfectHash& ph, std::vector<std::pair<uint16_t, uint16_t>>& buckets) {
    for (auto&& it: grams) {
        std::string key = DumpKey(it.first);
        uint32_t bucket = ph.Hash(key);
        if (bucket >= buckets.size()) {
            std::cerr << bucket << " " << buckets.size() << "\n";
        }
        assert(bucket < buckets.size());
        std::pair<uint16_t, uint16_t> data;
        data.first = CityHash16(key);
        data.second = PackInt32(it.second);
        buckets[bucket] = data;
    }
}